

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O2

int run_test_tcp6_local_connect_timeout(void)

{
  int iVar1;
  short *psVar2;
  uv_loop_t *puVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  int count;
  int64_t eval_b;
  sockaddr_in6 addr;
  
  iVar1 = is_supported_system();
  if (iVar1 == 0) {
    pcVar6 = "Unsupported system";
  }
  else {
    iVar1 = uv_interface_addresses((uv_interface_address_t **)&addr,&count);
    if (iVar1 == 0) {
      psVar2 = (short *)(addr._0_8_ + 0x14);
      bVar8 = false;
      for (lVar4 = 0; (!bVar8 && (lVar4 < count)); lVar4 = lVar4 + 1) {
        bVar8 = *psVar2 == 10;
        psVar2 = psVar2 + 0x30;
      }
      uv_free_interface_addresses((uv_interface_address_t *)addr._0_8_,count);
      if (bVar8) {
        iVar1 = uv_ip6_addr("::1",9999,&addr);
        _count = (long)iVar1;
        eval_b = 0;
        if (_count == 0) {
          puVar3 = uv_default_loop();
          iVar1 = uv_timer_init(puVar3,&timer);
          _count = (long)iVar1;
          eval_b = 0;
          if (_count == 0) {
            iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
            _count = (long)iVar1;
            eval_b = 0;
            if (_count == 0) {
              puVar3 = uv_default_loop();
              iVar1 = uv_tcp_init(puVar3,&conn);
              _count = (long)iVar1;
              eval_b = 0;
              if (_count == 0) {
                iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&addr,connect_local_cb);
                if (iVar1 == -0x65) {
                  pcVar6 = "Network unreachable.";
                  goto LAB_001855f6;
                }
                _count = (long)iVar1;
                eval_b = 0;
                if (_count == 0) {
                  puVar3 = uv_default_loop();
                  iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
                  _count = (long)iVar1;
                  eval_b = 0;
                  if (_count == 0) {
                    puVar3 = uv_default_loop();
                    close_loop(puVar3);
                    _count = 0;
                    puVar3 = uv_default_loop();
                    iVar1 = uv_loop_close(puVar3);
                    eval_b = (int64_t)iVar1;
                    if (_count == eval_b) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar7 = "uv_loop_close(uv_default_loop())";
                    pcVar6 = "0";
                    uVar5 = 0xc2;
                  }
                  else {
                    pcVar7 = "0";
                    pcVar6 = "r";
                    uVar5 = 0xc0;
                  }
                }
                else {
                  pcVar7 = "0";
                  pcVar6 = "r";
                  uVar5 = 0xbd;
                }
              }
              else {
                pcVar7 = "0";
                pcVar6 = "r";
                uVar5 = 0xb5;
              }
            }
            else {
              pcVar7 = "0";
              pcVar6 = "r";
              uVar5 = 0xb2;
            }
          }
          else {
            pcVar7 = "0";
            pcVar6 = "r";
            uVar5 = 0xae;
          }
        }
        else {
          pcVar7 = "0";
          pcVar6 = "uv_ip6_addr(\"::1\", 9999, &addr)";
          uVar5 = 0xab;
        }
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
                ,uVar5,pcVar6,"==",pcVar7,_count,"==",eval_b);
        abort();
      }
    }
    pcVar6 = "IPv6 not supported";
  }
LAB_001855f6:
  fprintf(_stderr,"%s\n",pcVar6);
  fflush(_stderr);
  return 7;
}

Assistant:

TEST_IMPL(tcp6_local_connect_timeout) {
  struct sockaddr_in6 addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  if (!can_ipv6()) {
    RETURN_SKIP("IPv6 not supported");
  }

  ASSERT_OK(uv_ip6_addr("::1", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}